

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_swap3d_topology.cpp
# Opt level: O0

HostFew<Omega_h::Read<int>,_4> *
Omega_h::swap3d_topology
          (HostFew<Omega_h::Read<int>,_4> *__return_storage_ptr__,Mesh *mesh,LOs *keys2edges,
          Read<signed_char> *edge_configs,HostFew<Omega_h::Read<int>,_4> *keys2prods)

{
  void **__return_storage_ptr___00;
  int iVar1;
  int iVar2;
  Read<int> *local_3d0;
  undefined8 *local_348;
  Write<int> local_310;
  Read<int> local_300;
  int local_2f0;
  undefined1 local_2e9;
  Int prod_dim_1;
  type f;
  LO nkeys;
  Write<int> local_1d0;
  int local_1bc;
  undefined1 auStack_1b8 [4];
  Int prod_dim;
  HostFew<Omega_h::Write<int>,_4> prod_verts2verts_w;
  LOs tet_verts2verts;
  LOs edge_verts2verts;
  Read<signed_char> edge_tet_codes;
  LOs edge_tets2tets;
  undefined1 local_128 [8];
  LOs edges2edge_tets;
  Adj edges2tets;
  HostFew<Omega_h::Read<int>,_4> *keys2prods_local;
  Read<signed_char> *edge_configs_local;
  LOs *keys2edges_local;
  Mesh *mesh_local;
  HostFew<Omega_h::Read<int>,_4> *prod_verts2verts;
  ulong local_38;
  
  __return_storage_ptr___00 = &edges2edge_tets.write_.shared_alloc_.direct_ptr;
  edges2tets.codes.write_.shared_alloc_.direct_ptr = keys2prods;
  Mesh::ask_up((Adj *)__return_storage_ptr___00,mesh,1,3);
  Read<int>::Read((Read<int> *)local_128,(Read<int> *)__return_storage_ptr___00);
  Read<int>::Read((Read<int> *)&edge_tet_codes.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&edges2tets.super_Graph.a2ab.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&edge_verts2verts.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)&edges2tets.super_Graph.ab2b.write_.shared_alloc_.direct_ptr);
  Mesh::ask_verts_of((Mesh *)&tet_verts2verts.write_.shared_alloc_.direct_ptr,(Int)mesh);
  Mesh::ask_verts_of((Mesh *)&prod_verts2verts_w.array_[3].shared_alloc_.direct_ptr,(Int)mesh);
  local_348 = (undefined8 *)auStack_1b8;
  do {
    *local_348 = 0;
    local_348[1] = 0;
    local_348 = local_348 + 2;
  } while ((void **)local_348 != &prod_verts2verts_w.array_[3].shared_alloc_.direct_ptr);
  for (local_1bc = 1; local_1bc < 4; local_1bc = local_1bc + 1) {
    iVar1 = Read<int>::last(keys2prods->array_ + local_1bc);
    iVar2 = local_1bc + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&nkeys,"",
               (allocator *)((long)&f.prod_verts2verts_w.array_[3].shared_alloc_.direct_ptr + 7));
    Write<int>::Write(&local_1d0,iVar1 * iVar2,(string *)&nkeys);
    Write<int>::operator=
              ((Write<int> *)
               &prod_verts2verts_w.array_[(long)local_1bc + -1].shared_alloc_.direct_ptr,&local_1d0)
    ;
    Write<int>::~Write(&local_1d0);
    std::__cxx11::string::~string((string *)&nkeys);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&f.prod_verts2verts_w.array_[3].shared_alloc_.direct_ptr + 7));
  }
  if (((ulong)(keys2edges->write_).shared_alloc_.alloc & 1) == 0) {
    local_38 = ((keys2edges->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_38 = (ulong)(keys2edges->write_).shared_alloc_.alloc >> 3;
  }
  f.prod_verts2verts_w.array_[3].shared_alloc_.direct_ptr._0_4_ = (LO)(local_38 >> 2);
  Read<int>::Read((Read<int> *)&prod_dim_1,keys2edges);
  Read<signed_char>::Read
            ((Read<signed_char> *)&f.keys2edges.write_.shared_alloc_.direct_ptr,edge_configs);
  Read<int>::Read((Read<int> *)&f.edge_configs.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)local_128);
  Read<int>::Read((Read<int> *)&f.edges2edge_tets.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&edge_tet_codes.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&f.edge_tets2tets.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)&edge_verts2verts.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)&f.edge_tet_codes.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&tet_verts2verts.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)&f.edge_verts2verts.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&prod_verts2verts_w.array_[3].shared_alloc_.direct_ptr);
  HostFew<Omega_h::Read<int>,_4>::HostFew
            ((HostFew<Omega_h::Read<int>,_4> *)&f.tet_verts2verts.write_.shared_alloc_.direct_ptr,
             keys2prods);
  HostFew<Omega_h::Write<int>,_4>::HostFew
            ((HostFew<Omega_h::Write<int>,_4> *)
             &f.keys2prods.array_[3].write_.shared_alloc_.direct_ptr,
             (HostFew<Omega_h::Write<int>,_4> *)auStack_1b8);
  parallel_for<Omega_h::swap3d_topology(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,Omega_h::HostFew<Omega_h::Read<int>,4>)::__0>
            ((LO)f.prod_verts2verts_w.array_[3].shared_alloc_.direct_ptr,(type *)&prod_dim_1,
             "swap3d_topology");
  local_2e9 = 0;
  local_3d0 = __return_storage_ptr__->array_;
  do {
    ((SharedAlloc *)&(local_3d0->write_).shared_alloc_.alloc)->alloc = (Alloc *)0x0;
    (local_3d0->write_).shared_alloc_.direct_ptr = (void *)0x0;
    local_3d0 = local_3d0 + 1;
  } while ((HostFew<Omega_h::Read<int>,_4> *)local_3d0 != __return_storage_ptr__ + 1);
  for (local_2f0 = 1; local_2f0 < 4; local_2f0 = local_2f0 + 1) {
    Write<int>::Write(&local_310,
                      (Write<int> *)
                      &prod_verts2verts_w.array_[(long)local_2f0 + -1].shared_alloc_.direct_ptr);
    Read<int>::Read(&local_300,&local_310);
    Read<int>::operator=(__return_storage_ptr__->array_ + local_2f0,&local_300);
    Read<int>::~Read(&local_300);
    Write<int>::~Write(&local_310);
  }
  local_2e9 = 1;
  swap3d_topology(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,Omega_h::HostFew<Omega_h::Read<int>,4>)
  ::$_0::~__0((__0 *)&prod_dim_1);
  HostFew<Omega_h::Write<int>,_4>::~HostFew((HostFew<Omega_h::Write<int>,_4> *)auStack_1b8);
  Read<int>::~Read((Read<int> *)&prod_verts2verts_w.array_[3].shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&tet_verts2verts.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read((Read<signed_char> *)&edge_verts2verts.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&edge_tet_codes.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)local_128);
  Adj::~Adj((Adj *)&edges2edge_tets.write_.shared_alloc_.direct_ptr);
  return __return_storage_ptr__;
}

Assistant:

HostFew<LOs, 4> swap3d_topology(Mesh* mesh, LOs keys2edges,
    Read<I8> edge_configs, HostFew<LOs, 4> keys2prods) {
  auto edges2tets = mesh->ask_up(EDGE, REGION);
  auto edges2edge_tets = edges2tets.a2ab;
  auto edge_tets2tets = edges2tets.ab2b;
  auto edge_tet_codes = edges2tets.codes;
  auto edge_verts2verts = mesh->ask_verts_of(EDGE);
  auto tet_verts2verts = mesh->ask_verts_of(REGION);
  HostFew<Write<LO>, 4> prod_verts2verts_w;
  for (Int prod_dim = EDGE; prod_dim <= REGION; ++prod_dim) {
    prod_verts2verts_w[prod_dim] =
        Write<LO>(keys2prods[prod_dim].last() * Int(prod_dim + 1));
  }
  auto nkeys = keys2edges.size();
  auto f = OMEGA_H_LAMBDA(LO key) {
    auto edge = keys2edges[key];
    auto config = edge_configs[edge];
    auto loop = swap3d::find_loop(edges2edge_tets, edge_tets2tets,
        edge_tet_codes, edge_verts2verts, tet_verts2verts, edge);
    auto nplane_tris = swap3d::swap_mesh_sizes[loop.size];
    auto nplane_edges = swap3d::nedges[loop.size];
    for (Int plane_edge = 0; plane_edge < nplane_edges; ++plane_edge) {
      auto unique_edge = swap3d::edges2unique[loop.size][config][plane_edge];
      Few<LO, 2> plane_edge_verts;
      for (Int pev = 0; pev < 2; ++pev) {
        auto loop_vert = swap3d::unique_edges[loop.size][unique_edge][pev];
        auto vert = loop.loop_verts2verts[loop_vert];
        plane_edge_verts[pev] = vert;
      }
      auto prod_edge = keys2prods[EDGE][key] + plane_edge;
      for (Int pev = 0; pev < 2; ++pev) {
        prod_verts2verts_w[EDGE][prod_edge * 2 + pev] = plane_edge_verts[pev];
      }
      for (Int eev = 0; eev < 2; ++eev) {
        Few<LO, 3> new_tri_verts;
        for (Int nfv = 0; nfv < 2; ++nfv) {
          new_tri_verts[nfv] = plane_edge_verts[nfv];
        }
        new_tri_verts[2] = loop.eev2v[eev];
        auto prod_tri = keys2prods[FACE][key] + 2 * plane_edge + eev;
        for (Int nfv = 0; nfv < 3; ++nfv) {
          prod_verts2verts_w[FACE][prod_tri * 3 + nfv] = new_tri_verts[nfv];
        }
      }
    }
    for (Int plane_tri = 0; plane_tri < nplane_tris; ++plane_tri) {
      auto uniq_tri =
          swap3d::swap_meshes[loop.size][config * nplane_tris + plane_tri];
      Few<LO, 3> plane_tri_verts;
      for (Int pfv = 0; pfv < 3; ++pfv) {
        auto loop_vert = swap3d::swap_triangles[loop.size][uniq_tri][pfv];
        auto vert = loop.loop_verts2verts[loop_vert];
        plane_tri_verts[pfv] = vert;
      }
      auto prod_tri = keys2prods[FACE][key] + 2 * nplane_edges + plane_tri;
      for (Int pfv = 0; pfv < 3; ++pfv) {
        prod_verts2verts_w[FACE][prod_tri * 3 + pfv] = plane_tri_verts[pfv];
      }
      for (Int eev = 0; eev < 2; ++eev) {
        auto prod_tet = keys2prods[REGION][key] + 2 * plane_tri + eev;
        Few<LO, 4> new_tet_verts;
        for (Int pfv = 0; pfv < 3; ++pfv) {
          new_tet_verts[pfv] = plane_tri_verts[pfv];
        }
        if (eev == 0) swap2(new_tet_verts[1], new_tet_verts[2]);
        new_tet_verts[3] = loop.eev2v[eev];
        for (Int nrv = 0; nrv < 4; ++nrv) {
          prod_verts2verts_w[REGION][prod_tet * 4 + nrv] = new_tet_verts[nrv];
        }
      }
    }
  };
  parallel_for(nkeys, f, "swap3d_topology");
  HostFew<LOs, 4> prod_verts2verts;
  for (Int prod_dim = EDGE; prod_dim <= REGION; ++prod_dim) {
    prod_verts2verts[prod_dim] = prod_verts2verts_w[prod_dim];
  }
  return prod_verts2verts;
}